

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall llvm::AppleAcceleratorTable::Entry::Entry(Entry *this,HeaderData *HdrData)

{
  size_t N;
  DWARFFormValue local_78;
  const_iterator local_48;
  pair<unsigned_short,_llvm::dwarf::Form> *Atom;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U> *__range1;
  HeaderData *local_18;
  HeaderData *HdrData_local;
  Entry *this_local;
  
  local_18 = HdrData;
  HdrData_local = (HeaderData *)this;
  DWARFAcceleratorTable::Entry::Entry(&this->super_Entry);
  (this->super_Entry)._vptr_Entry = (_func_int **)&PTR_getCUOffset_030a33d8;
  this->HdrData = local_18;
  N = SmallVectorBase::size((SmallVectorBase *)&local_18->Atoms);
  SmallVectorImpl<llvm::DWARFFormValue>::reserve
            (&(this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>,N);
  __begin1 = (const_iterator)&local_18->Atoms;
  __end1 = SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>::begin
                     ((SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                       *)__begin1);
  Atom = SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>::end
                   ((SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void> *
                    )__begin1);
  for (; __end1 != Atom; __end1 = __end1 + 1) {
    local_48 = __end1;
    DWARFFormValue::DWARFFormValue(&local_78,__end1->second);
    SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::push_back
              ((SmallVectorTemplateBase<llvm::DWARFFormValue,_true> *)&(this->super_Entry).Values,
               &local_78);
  }
  return;
}

Assistant:

AppleAcceleratorTable::Entry::Entry(
    const AppleAcceleratorTable::HeaderData &HdrData)
    : HdrData(&HdrData) {
  Values.reserve(HdrData.Atoms.size());
  for (const auto &Atom : HdrData.Atoms)
    Values.push_back(DWARFFormValue(Atom.second));
}